

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int CVmObjVector::static_getp_generate(vm_val_t *retval,uint *in_argc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  uint uVar7;
  vm_obj_id_t vVar8;
  uint uVar9;
  long lVar10;
  vm_val_t *val;
  long *plVar11;
  CVmFuncPtr funcdesc;
  vm_rcdesc rc;
  uint local_9c;
  CVmFuncPtr local_80;
  vm_rcdesc local_78;
  
  if (in_argc == (uint *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = *in_argc;
  }
  if (static_getp_generate(vm_val_t*,unsigned_int*)::desc == '\0') {
    static_getp_generate();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,in_argc,&static_getp_generate::desc);
  if (iVar6 == 0) {
    val = sp_ + -1;
    local_80.p_ = (uchar *)0x0;
    iVar6 = CVmFuncPtr::set(&local_80,val);
    if (iVar6 == 0) {
      err_throw(0x900);
    }
    if (sp_[-2].typ == VM_INT) {
      uVar7 = sp_[-2].val.intval;
    }
    else {
      uVar7 = vm_val_t::nonint_num_to_int(sp_ + -2);
    }
    if ((int)uVar7 < 0) {
      err_throw(0x902);
    }
    vVar8 = create(0,(ulong)uVar7);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    pvVar5 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar8 >> 0xc];
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar2;
    if ((char)*local_80.p_ < '\0') {
      local_9c = 1;
    }
    else {
      local_9c = (uint)(*local_80.p_ != '\0' || local_80.p_[1] != '\0');
    }
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"Vector.generate");
    if (uVar7 != 0) {
      plVar11 = (long *)((long)&pCVar1[vVar8 & 0xfff].ptr_ + 8);
      vVar8 = 1;
      lVar10 = 0;
      do {
        pvVar5 = sp_;
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = VM_INT;
        (pvVar5->val).obj = vVar8;
        CVmRun::call_func_ptr(&G_interpreter_X,val,local_9c,&local_78,0);
        sp_ = sp_ + -(ulong)(local_9c ^ 1);
        vmb_put_dh((char *)(*plVar11 + lVar10 + 4),&r0_);
        *(short *)(*plVar11 + 2) = (short)vVar8;
        lVar10 = lVar10 + 5;
        vVar8 = vVar8 + 1;
      } while ((ulong)uVar7 * 5 != lVar10);
    }
    sp_ = sp_ + -(long)(int)(uVar9 + 1);
  }
  return 1;
}

Assistant:

int CVmObjVector::static_getp_generate(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the callback function argument */
    vm_val_t *func = G_stk->get(0);

    /* make sure it's a function; set up a header pointer if it is */
    CVmFuncPtr funcdesc;
    if (!funcdesc.set(vmg_ func))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the count */
    int32_t cnt = G_stk->get(1)->num_to_int(vmg0_);

    /* make sure it's not negative */
    if (cnt < 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* create the vector */
    retval->set_obj(CVmObjVector::create(vmg_ FALSE, cnt));
    CVmObjVector *vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);
    
    /* push the new vector for gc protection */
    G_stk->push(retval);
    
    /* find out how many arguments the function wants */
    int fargc = funcdesc.is_varargs() ? -1 : funcdesc.get_max_argc();

    /* set up our recursive call descriptor */
    vm_rcdesc rc(vmg_ "Vector.generate",
                 CVmObjVector::metaclass_reg_->get_class_obj(vmg0_),
                 PROPIDX_generate, func, argc);

    /* generate the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* push the callback arguments */
        const int pushed_argc = 1;
        G_stk->push()->set_int(i+1);
        
        /* adjust the arguments for what the callback actually wants */
        int sent_argc = fargc < 0 || fargc > pushed_argc ? pushed_argc : fargc;
        
        /* call the callback */
        G_interpreter->call_func_ptr(vmg_ func, sent_argc, &rc, 0);
        
        /* discard excess arguments */
        G_stk->discard(pushed_argc - sent_argc);
        
        /* add the result to the list */
        vec->set_element(i, G_interpreter->get_r0());
        vec->set_element_count(i+1);
    }

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}